

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar xmlPopInput(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlParserInputPtr input;
  
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    if (ctxt->inputNr < 2) {
      xVar1 = '\0';
    }
    else {
      input = xmlCtxtPopInput(ctxt);
      xmlFreeInputStream(input);
      xVar1 = *ctxt->input->cur;
      if (xVar1 == '\0') {
        xmlParserGrow(ctxt);
        xVar1 = *ctxt->input->cur;
      }
    }
    return xVar1;
  }
  return '\0';
}

Assistant:

xmlChar
xmlPopInput(xmlParserCtxtPtr ctxt) {
    xmlParserInputPtr input;

    if ((ctxt == NULL) || (ctxt->inputNr <= 1)) return(0);
    input = xmlCtxtPopInput(ctxt);
    xmlFreeInputStream(input);
    if (*ctxt->input->cur == 0)
        xmlParserGrow(ctxt);
    return(CUR);
}